

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactorRational::solveUleft
          (CLUFactorRational *this,Rational *vec,int *vecidx,Rational *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar6;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *o;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  pointer v;
  type t;
  Rational y;
  Rational x;
  uint local_180;
  uint local_17c;
  longlong local_178;
  int local_16c;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_168;
  char local_153;
  char local_152;
  uint local_148;
  void *local_140;
  char local_133;
  char local_132;
  data_type local_128;
  undefined4 local_118;
  undefined2 local_114;
  char local_112;
  data_type local_108;
  undefined4 local_f8;
  ushort local_f4;
  char local_f2;
  data_type local_e8;
  undefined4 local_d8;
  undefined2 local_d4;
  char local_d2;
  data_type local_c8;
  undefined4 local_b8;
  undefined2 local_b4;
  char local_b2;
  CLUFactorRational *local_a0;
  int *local_98;
  int *local_90;
  Rational *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  Rational *local_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  long local_40;
  int *local_38;
  
  uVar3 = 0;
  local_e8.la[0] = 0;
  local_d8 = 1;
  local_d4 = 0x100;
  local_d2 = '\0';
  local_c8.la[0] = 1;
  local_b8 = 1;
  local_b4 = 0x100;
  local_b2 = '\0';
  local_128.la[0] = 0;
  local_118 = 1;
  local_114 = 0x100;
  local_112 = '\0';
  local_108.la[0] = 1;
  local_f8 = 1;
  local_f4 = 0x100;
  local_f2 = '\0';
  local_17c = rhsn;
  local_88 = rhs;
  local_60 = vec;
  local_58 = vecidx;
  if (0 < rhsn) {
    local_68 = (this->row).orig;
    local_50 = (this->col).orig;
    local_90 = (this->col).perm;
    uVar3 = 0;
    do {
      iVar1 = local_90[rhsidx[uVar3]];
      if (uVar3 == 0) {
        lVar8 = 0;
      }
      else {
        uVar9 = uVar3 & 0xffffffff;
        do {
          uVar10 = (uint)uVar9 - 1;
          uVar7 = uVar10 >> 1;
          uVar5 = (uint)uVar9;
          if (rhsidx[uVar7] <= iVar1) break;
          rhsidx[uVar9] = rhsidx[uVar7];
          uVar9 = (ulong)uVar7;
          uVar5 = uVar7;
        } while (1 < uVar10);
        lVar8 = (long)(int)uVar5;
      }
      uVar3 = uVar3 + 1;
      rhsidx[lVar8] = iVar1;
    } while (uVar3 != (uint)rhsn);
    if (rhsn < 1) {
      uVar3 = 0;
    }
    else {
      local_78 = (this->u).row.idx;
      local_80 = (this->u).row.start;
      local_70 = (this->u).row.len;
      uVar3 = 0;
      local_a0 = this;
      local_98 = rhsidx;
      do {
        iVar1 = deQueueMinRat(rhsidx,(int *)&local_17c);
        pcVar6 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(local_88 + local_50[iVar1]);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_e8.ld,pcVar6);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_c8.ld,pcVar6 + 1);
        local_168.arg1 = (pointer)0x0;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                     *)pcVar6,(longlong *)&local_168);
        local_178 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_168,&local_178,(type *)0x0);
        iVar2 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_e8.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_168);
        if ((local_133 == '\0') && (local_132 == '\0')) {
          operator_delete(local_140,(ulong)local_148 << 3);
        }
        if ((local_153 == '\0') && (local_152 == '\0')) {
          operator_delete(local_168.arg2,((ulong)local_168.arg1 & 0xffffffff) << 3);
        }
        if (iVar2 != 0) {
          iVar1 = local_68[iVar1];
          local_58[(int)uVar3] = iVar1;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&local_e8.ld,
                       (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)((this->diag).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar1));
          pcVar6 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)(local_60 + iVar1);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::assign(pcVar6,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           *)&local_e8.ld);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::assign(pcVar6 + 1,
                   (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_c8.ld);
          local_180 = local_17c;
          local_48 = uVar3;
          if (local_70[iVar1] != 0) {
            piVar4 = local_78 + local_80[iVar1];
            v = (local_a0->u).row.val.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_80[iVar1];
            local_16c = local_70[iVar1];
            do {
              local_40 = (long)*piVar4;
              o = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)(local_88 + local_40);
              local_38 = piVar4;
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_128.ld,o);
              pcVar6 = o + 1;
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_108.ld,pcVar6);
              local_178 = 0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_168,&local_178,(type *)0x0);
              iVar1 = boost::multiprecision::backends::
                      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)&local_128.ld,
                                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)&local_168);
              if ((local_133 == '\0') && (local_132 == '\0')) {
                operator_delete(local_140,(ulong)local_148 << 3);
              }
              if ((local_153 == '\0') && (local_152 == '\0')) {
                operator_delete(local_168.arg2,((ulong)local_168.arg1 & 0xffffffff) << 3);
              }
              if (iVar1 == 0) {
                local_168.arg2 = (type)&local_e8;
                local_168.arg1 = v;
                boost::multiprecision::
                number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                ::
                do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                            *)&local_128.ld,&local_168,(multiply_immediates *)&local_178);
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::negate((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_128.ld);
                local_178 = 0;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::rational_adaptor<long_long>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_168,&local_178,(type *)0x0);
                iVar1 = boost::multiprecision::backends::
                        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)&local_128.ld,
                                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)&local_168);
                if ((local_133 == '\0') && (local_132 == '\0')) {
                  operator_delete(local_140,(ulong)local_148 << 3);
                }
                if ((local_153 == '\0') && (local_152 == '\0')) {
                  operator_delete(local_168.arg2,((ulong)local_168.arg1 & 0xffffffff) << 3);
                }
                if (iVar1 != 0) {
                  boost::multiprecision::backends::
                  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  ::assign(o,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                              *)&local_128.ld);
                  boost::multiprecision::backends::
                  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  ::assign(pcVar6,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                   *)&local_108.ld);
                  iVar1 = local_90[local_40];
                  uVar5 = local_180;
                  if (0 < (int)local_180) {
                    do {
                      uVar7 = uVar5 - 1;
                      uVar10 = uVar7 >> 1;
                      if (local_98[uVar10] <= iVar1) break;
                      local_98[uVar5] = local_98[uVar10];
                      uVar5 = uVar10;
                    } while (1 < uVar7);
                  }
                  local_180 = local_180 + 1;
                  local_98[(int)uVar5] = iVar1;
                }
              }
              else {
                boost::multiprecision::default_ops::
                eval_multiply_subtract<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_128.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_e8.ld,&v->m_backend);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign(o,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            *)&local_128.ld);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign(pcVar6,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                 *)&local_108.ld);
              }
              piVar4 = local_38 + 1;
              v = v + 1;
              local_16c = local_16c + -1;
            } while (local_16c != 0);
          }
          uVar3 = (ulong)((int)local_48 + 1);
          local_17c = local_180;
          rhsidx = local_98;
          this = local_a0;
        }
      } while (0 < (int)local_17c);
      if (((local_f4 & 0x100) == 0) && (local_f2 == '\0')) {
        operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
      }
    }
  }
  if ((local_114._1_1_ == '\0') && (local_112 == '\0')) {
    operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
  }
  if ((local_b4._1_1_ == '\0') && (local_b2 == '\0')) {
    operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
  }
  if ((local_d4._1_1_ == '\0') && (local_d2 == '\0')) {
    operator_delete(local_e8.ld.data,(local_e8.la[0] & 0xffffffff) << 3);
  }
  return (int)uVar3;
}

Assistant:

inline int CLUFactorRational::solveUleft(Rational* vec, int* vecidx,
      Rational* rhs, int* rhsidx, int rhsn)
{
   Rational x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   Rational* val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMinRat(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   VectorRational& rval = u.row.val;

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMinRat(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(x != 0)
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.val.dim());
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(y != 0)
               {
                  rhs[j] = y;
                  enQueueMinRat(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               //               rhs[j] = ( y != 0 ) ? y : SOPLEX_MARKER;
               rhs[j] = y;
            }
         }
      }
   }

   return n;
}